

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipstream.cpp
# Opt level: O0

void __thiscall ZipStream::ZipStream(ZipStream *this,string *zipName)

{
  unsigned_short uVar1;
  uint uVar2;
  pointer target;
  type pcVar3;
  long pos;
  size_t sVar4;
  int64_t iVar5;
  ulong uVar6;
  undefined8 uVar7;
  uint uStack_200fc;
  undefined4 uStack_200f8;
  uint32_t flags;
  uint32_t gid;
  uint32_t uid;
  uint8_t *ptr;
  Extra extra;
  int exLen;
  int64_t offset;
  size_t rc;
  CentralDirEntry cd;
  long i;
  char fileName [65536];
  EndOfCentralDir64 eocd64;
  long cdStart;
  unsigned_short local_4a;
  ulong uStack_48;
  unsigned_short commentLen;
  int64_t cdOffset;
  int64_t entryCount;
  size_t start;
  uint local_28;
  int counter;
  uint32_t id;
  string *local_18;
  string *zipName_local;
  ZipStream *this_local;
  
  local_18 = zipName;
  zipName_local = (string *)this;
  std::vector<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>::vector(&this->entries_);
  std::unique_ptr<char[],std::default_delete<char[]>>::unique_ptr<std::default_delete<char[]>,void>
            ((unique_ptr<char[],std::default_delete<char[]>> *)&this->comment_);
  std::__cxx11::string::string((string *)&this->zipName_,(string *)local_18);
  File::File(&this->f_,local_18,READ);
  local_28 = 0;
  uVar7 = 0xffffffffffffffef;
  File::seek(&this->f_,-0x11,2);
  for (start._4_4_ = 0x10008; local_28 != 0x6054b50 && 0 < start._4_4_;
      start._4_4_ = start._4_4_ + -1) {
    uVar7 = 0xfffffffffffffffb;
    File::seek(&this->f_,-5,1);
    local_28 = File::Read<unsigned_int>(&this->f_);
  }
  if (start._4_4_ < 1) {
    File::close(&this->f_,(int)uVar7);
  }
  else {
    entryCount = File::tell(&this->f_);
    File::seek(&this->f_,4,1);
    uVar1 = File::Read<unsigned_short>(&this->f_);
    cdOffset = (int64_t)uVar1;
    File::seek(&this->f_,2,1);
    File::Read<unsigned_int>(&this->f_);
    uVar2 = File::Read<unsigned_int>(&this->f_);
    uStack_48 = (ulong)uVar2;
    local_4a = File::Read<unsigned_short>(&this->f_);
    if (local_4a != 0) {
      std::make_unique<char[]>((size_t)&cdStart);
      std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=
                (&this->comment_,(unique_ptr<char[],_std::default_delete<char[]>_> *)&cdStart);
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)&cdStart);
      target = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->comment_);
      File::Read<char>(&this->f_,target,(ulong)local_4a);
      pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                         (&this->comment_,(ulong)local_4a);
      *pcVar3 = '\0';
    }
    if ((cdOffset == 0xffff) || (uStack_48 == 0xffffffff)) {
      File::seek(&this->f_,entryCount + -0x18,0);
      local_28 = File::Read<unsigned_int>(&this->f_);
      if (local_28 != 0x7064b50) {
        return;
      }
      File::seek(&this->f_,4,1);
      pos = File::Read<long>(&this->f_);
      File::seek(&this->f_,pos,0);
      File::Read<EndOfCentralDir64>((EndOfCentralDir64 *)(fileName + 0xfff8),&this->f_);
      uStack_48 = eocd64.cdsize;
      cdOffset = eocd64.diskentries;
    }
    std::vector<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>::reserve
              (&this->entries_,cdOffset);
    File::seek(&this->f_,uStack_48,0);
    cd.attr1 = 0;
    cd.offset = 0;
    for (; (long)cd._38_8_ < cdOffset; cd._38_8_ = cd._38_8_ + 1) {
      File::Read<CentralDirEntry>((CentralDirEntry *)((long)&rc + 2),&this->f_);
      sVar4 = File::Read<char[65536]>(&this->f_,(char (*) [65536])&i,(ulong)(ushort)cd.compSize);
      fileName[sVar4 - 8] = '\0';
      File::seek(&this->f_,(ushort)cd.compSize - sVar4,1);
      register0x00000000 = (ulong)(uint)cd._34_4_;
      extra.field_2._65527_4_ = ZEXT24(cd.compSize._2_2_);
      memset((void *)((long)&ptr + 1),0,0x10003);
      for (; 0 < (int)extra.field_2._65527_4_;
          extra.field_2._65527_4_ = extra.field_2._65527_4_ - (ptr._3_2_ + 4)) {
        File::Read<unsigned_char>(&this->f_,(uchar *)((long)&ptr + 1),4);
        File::Read<unsigned_char>(&this->f_,(uchar *)((long)&ptr + 5),(ulong)ptr._3_2_);
        if (ptr._1_2_ == 1) {
          stack0xfffffffffffeff20 = extra.field_2.zip64.compSize;
        }
        else if (ptr._1_2_ == 0x7875) {
          _gid = (uint8_t *)((long)&ptr + 6);
          iVar5 = decodeInt((uint8_t **)&gid);
          flags = (uint32_t)iVar5;
          uVar6 = decodeInt((uint8_t **)&gid);
          uStack_200f8 = (undefined4)uVar6;
          printf("UID %x GID %x\n",(ulong)flags,uVar6 & 0xffffffff);
        }
        else if (ptr._1_2_ != 0x5455) {
          printf("**Warning: Ignoring extra block %04x\n",(ulong)ptr._1_2_);
        }
      }
      File::seek(&this->f_,(ulong)(ushort)cd.uncompSize,1);
      uStack_200fc = 0;
      std::vector<ZipStream::Entry,std::allocator<ZipStream::Entry>>::
      emplace_back<char(&)[65536],long&,unsigned_int_const&>
                ((vector<ZipStream::Entry,std::allocator<ZipStream::Entry>> *)this,
                 (char (*) [65536])&i,(long *)(extra.field_2.data + 0xfffb),&uStack_200fc);
    }
  }
  return;
}

Assistant:

ZipStream::ZipStream(const std::string& zipName)
    : zipName_(zipName), f_{zipName}
{
    uint32_t id = 0;
    // Find CD by scanning backwards from end
    f_.seek(-22 + 5, SEEK_END);
    int counter = 64 * 1024 + 8;
    while (id != EndOfCD_SIG && counter > 0) {
        f_.seek(-5, SEEK_CUR);
        id = f_.Read<uint32_t>();
        counter--;
    }
    if (counter <= 0) {
        f_.close();
        return;
    }

    auto start = f_.tell();
    f_.seek(4, SEEK_CUR);
    int64_t entryCount = f_.Read<uint16_t>();
    f_.seek(2, SEEK_CUR);
    /* auto cdSize = */ f_.Read<uint32_t>();
    int64_t cdOffset = f_.Read<uint32_t>();
    auto commentLen = f_.Read<uint16_t>();
    if (commentLen > 0) {
        comment_ = std::make_unique<char[]>(commentLen + 1);
        f_.Read(comment_.get(), commentLen);
        comment_[commentLen] = 0;
    }

    if (entryCount == 0xffff || cdOffset == 0xffffffff) {
        // Find zip64 data
        f_.seek(start - 6 * 4, SEEK_SET);
        id = f_.Read<uint32_t>();
        if (id != EndOfCD64Locator_SIG) {
            return;
        }
        f_.seek(4, SEEK_CUR);
        auto cdStart = f_.Read<int64_t>();
        f_.seek(cdStart, SEEK_SET);
        auto eocd64 = f_.Read<EndOfCentralDir64>();

        cdOffset = eocd64.cdoffset;
        entryCount = eocd64.entries;
    }

    entries_.reserve(entryCount);

    f_.seek(cdOffset, SEEK_SET);
    char fileName[65536];
    for (auto i = 0L; i < entryCount; i++) {
        auto const cd = f_.Read<CentralDirEntry>();
        auto const rc = f_.Read(&fileName, cd.nameLen);
        fileName[rc] = 0;
        f_.seek(cd.nameLen - rc, SEEK_CUR);
        int64_t offset = cd.offset;
        int exLen = cd.exLen;
        Extra extra{};
        while (exLen > 0) {
            f_.Read((uint8_t*)&extra, 4);
            f_.Read(extra.data, extra.size);
            if (extra.id == 0x01) {
                offset = extra.zip64.offset;
            } else if (extra.id == 0x7875) {
                auto const* ptr = &extra.data[1];
                uint32_t const uid = decodeInt(&ptr);
                uint32_t const gid = decodeInt(&ptr);
                printf("UID %x GID %x\n", uid, gid);
            } else if (extra.id == 0x5455) {
                // TODO: Read timestamps
            } else
                printf("**Warning: Ignoring extra block %04x\n", extra.id);

            exLen -= (extra.size + 4);
        }

        f_.seek(cd.commLen, SEEK_CUR);
        auto const flags = ((cd.attr1 & (S_IFREG >> 16)) == 0)
                               ? // Some archives have broken attributes
                               0
                               : cd.attr1 >> 16;
        entries_.emplace_back(fileName, offset, flags);
    }
}